

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_uint_base.cpp
# Opt level: O1

void __thiscall sc_dt::sc_uint_base::invalid_range(sc_uint_base *this,int l,int r)

{
  ostream *poVar1;
  stringstream msg;
  char *local_1c8;
  char local_1b8 [16];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"sc_uint[_base] part selection: ",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"left = ",7);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_198,l);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", right = ",10);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,r);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," violates ",10);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->m_len + -1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," >= left >= right >= 0",0x16);
  std::__cxx11::stringbuf::str();
  sc_core::sc_report_handler::report
            (SC_ERROR,"out of bounds",local_1c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/datatypes/int/sc_uint_base.cpp"
             ,0x16e);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  sc_core::sc_abort();
}

Assistant:

void
sc_uint_base::invalid_range( int l, int r ) const
{
    std::stringstream msg;
    msg << "sc_uint[_base] part selection: "
        << "left = " << l << ", right = " << r << " violates "
        << (m_len-1) << " >= left >= right >= 0";
    SC_REPORT_ERROR( sc_core::SC_ID_OUT_OF_BOUNDS_, msg.str().c_str() );
    sc_core::sc_abort(); // can't recover from here
}